

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O0

void __thiscall
writer_test_should_write_char_field_Test::TestBody(writer_test_should_write_char_field_Test *this)

{
  bool bVar1;
  char *message;
  Field<Fixpp::TagT<39U,_Fixpp::Type::Char>_> *field_00;
  AssertHelper local_1e0;
  Message local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  ostringstream local_190 [8];
  ostringstream oss;
  char local_13;
  Field<Fixpp::TagT<39U,_Fixpp::Type::Char>_> local_12;
  writer_test_should_write_char_field_Test *pwStack_10;
  Field field;
  writer_test_should_write_char_field_Test *this_local;
  
  pwStack_10 = this;
  Fixpp::Field<Fixpp::TagT<39U,_Fixpp::Type::Char>_>::Field(&local_12);
  local_13 = '4';
  Fixpp::Field<Fixpp::TagT<39U,_Fixpp::Type::Char>_>::set<char>(&local_12,&local_13);
  std::__cxx11::ostringstream::ostringstream(local_190);
  Fixpp::writeField<Fixpp::Field<Fixpp::TagT<39u,Fixpp::Type::Char>>>
            ((Fixpp *)local_190,(ostream *)&local_12,field_00);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[6]>
            ((EqHelper<false> *)local_1b0,"oss.str()","\"39=4|\"",&local_1d0,(char (*) [6])"39=4|");
  std::__cxx11::string::~string((string *)&local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0x5c,message);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

TEST(writer_test, should_write_char_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::OrdStatus>;
    Field field;
    field.set('4');

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "39=4|");
}